

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_assign_icc(LodePNGInfo *info,char *name,uchar *profile,uint profile_size)

{
  char *pcVar1;
  uchar *puVar2;
  uint profile_size_local;
  uchar *profile_local;
  char *name_local;
  LodePNGInfo *info_local;
  
  if (profile_size == 0) {
    info_local._4_4_ = 100;
  }
  else {
    pcVar1 = alloc_string(name);
    info->iccp_name = pcVar1;
    puVar2 = (uchar *)lodepng_malloc((ulong)profile_size);
    info->iccp_profile = puVar2;
    if ((info->iccp_name == (char *)0x0) || (info->iccp_profile == (uchar *)0x0)) {
      info_local._4_4_ = 0x53;
    }
    else {
      lodepng_memcpy(info->iccp_profile,profile,(ulong)profile_size);
      info->iccp_profile_size = profile_size;
      info_local._4_4_ = 0;
    }
  }
  return info_local._4_4_;
}

Assistant:

static unsigned lodepng_assign_icc(LodePNGInfo* info, const char* name, const unsigned char* profile, unsigned profile_size) {
  if(profile_size == 0) return 100; /*invalid ICC profile size*/

  info->iccp_name = alloc_string(name);
  info->iccp_profile = (unsigned char*)lodepng_malloc(profile_size);

  if(!info->iccp_name || !info->iccp_profile) return 83; /*alloc fail*/

  lodepng_memcpy(info->iccp_profile, profile, profile_size);
  info->iccp_profile_size = profile_size;

  return 0; /*ok*/
}